

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

void EccPoint_mult(uECC_word_t *result,uECC_word_t *point,uECC_word_t *scalar,uECC_word_t *initial_Z
                  ,bitcount_t num_bits,uECC_Curve curve)

{
  uECC_word_t (*src) [4];
  uECC_word_t (*dest) [4];
  uECC_word_t *Y2;
  char num_words;
  ulong uVar1;
  uECC_word_t *X2;
  uint uVar2;
  uECC_word_t *Y1;
  uECC_word_t *X1;
  bool bVar3;
  uECC_word_t Rx [2] [4];
  uECC_word_t z [4];
  uECC_word_t Ry [2] [4];
  
  num_words = curve->num_words;
  uECC_vli_set(Rx[1],point,num_words);
  dest = Ry + 1;
  uECC_vli_set(*dest,point + num_words,num_words);
  if (initial_Z == (uECC_word_t *)0x0) {
    uECC_vli_clear(z,num_words);
    z[0] = 1;
  }
  else {
    uECC_vli_set(z,initial_Z,num_words);
  }
  src = Rx + 1;
  uECC_vli_set(Rx[0],*src,num_words);
  uECC_vli_set(Ry[0],*dest,num_words);
  apply_z(*src,*dest,z,curve);
  (*curve->double_jacobian)(*src,*dest,z,curve);
  apply_z(Rx[0],Ry[0],z,curve);
  for (uVar2 = (ushort)num_bits - 2 & 0xffff; 0 < (short)uVar2; uVar2 = uVar2 - 1) {
    bVar3 = (scalar[uVar2 >> 6] & 1L << ((byte)uVar2 & 0x3f)) == 0;
    XYcZ_addC(Rx[!bVar3],Ry[!bVar3],Rx[bVar3],Ry[bVar3],curve);
    XYcZ_add(Rx[bVar3],Ry[bVar3],Rx[!bVar3],Ry[!bVar3],curve);
  }
  uVar2 = (uint)*scalar & 1;
  uVar1 = (ulong)(uVar2 << 5);
  X1 = (uECC_word_t *)((long)Rx[0] + uVar1);
  Y1 = (uECC_word_t *)((long)Ry[0] + uVar1);
  uVar1 = (ulong)((uVar2 ^ 1) << 5);
  X2 = (uECC_word_t *)((long)Rx[0] + uVar1);
  Y2 = (uECC_word_t *)((long)Ry[0] + uVar1);
  XYcZ_addC(X1,Y1,X2,Y2,curve);
  uECC_vli_modSub(z,Rx[1],Rx[0],curve->p,num_words);
  uECC_vli_modMult_fast(z,z,Y1,curve);
  uECC_vli_modMult_fast(z,z,point,curve);
  uECC_vli_modInv(z,z,curve->p,num_words);
  uECC_vli_modMult_fast(z,z,point + num_words,curve);
  uECC_vli_modMult_fast(z,z,X1,curve);
  XYcZ_add(X2,Y2,X1,Y1,curve);
  apply_z(Rx[0],Ry[0],z,curve);
  uECC_vli_set(result,Rx[0],num_words);
  uECC_vli_set(result + num_words,Ry[0],num_words);
  return;
}

Assistant:

static void EccPoint_mult(uECC_word_t * result,
                          const uECC_word_t * point,
                          const uECC_word_t * scalar,
                          const uECC_word_t * initial_Z,
                          bitcount_t num_bits,
                          uECC_Curve curve) {
    /* R0 and R1 */
    uECC_word_t Rx[2][uECC_MAX_WORDS];
    uECC_word_t Ry[2][uECC_MAX_WORDS];
    uECC_word_t z[uECC_MAX_WORDS];
    bitcount_t i;
    uECC_word_t nb;
    wordcount_t num_words = curve->num_words;

    uECC_vli_set(Rx[1], point, num_words);
    uECC_vli_set(Ry[1], point + num_words, num_words);

    XYcZ_initial_double(Rx[1], Ry[1], Rx[0], Ry[0], initial_Z, curve);

    for (i = num_bits - 2; i > 0; --i) {
        nb = !uECC_vli_testBit(scalar, i);
        XYcZ_addC(Rx[1 - nb], Ry[1 - nb], Rx[nb], Ry[nb], curve);
        XYcZ_add(Rx[nb], Ry[nb], Rx[1 - nb], Ry[1 - nb], curve);
    }

    nb = !uECC_vli_testBit(scalar, 0);
    XYcZ_addC(Rx[1 - nb], Ry[1 - nb], Rx[nb], Ry[nb], curve);

    /* Find final 1/Z value. */
    uECC_vli_modSub(z, Rx[1], Rx[0], curve->p, num_words); /* X1 - X0 */
    uECC_vli_modMult_fast(z, z, Ry[1 - nb], curve);               /* Yb * (X1 - X0) */
    uECC_vli_modMult_fast(z, z, point, curve);                    /* xP * Yb * (X1 - X0) */
    uECC_vli_modInv(z, z, curve->p, num_words);            /* 1 / (xP * Yb * (X1 - X0)) */
    /* yP / (xP * Yb * (X1 - X0)) */
    uECC_vli_modMult_fast(z, z, point + num_words, curve);
    uECC_vli_modMult_fast(z, z, Rx[1 - nb], curve); /* Xb * yP / (xP * Yb * (X1 - X0)) */
    /* End 1/Z calculation */

    XYcZ_add(Rx[nb], Ry[nb], Rx[1 - nb], Ry[1 - nb], curve);
    apply_z(Rx[0], Ry[0], z, curve);

    uECC_vli_set(result, Rx[0], num_words);
    uECC_vli_set(result + num_words, Ry[0], num_words);
}